

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::Datum::Clear(Datum *this)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  (this->float_data_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->data_).ptr_;
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x11a4);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_48,
                         "CHECK failed: !data_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      google::protobuf::internal::LogFinisher::operator=(&local_49,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_48);
      psVar2 = (this->data_).ptr_;
    }
    psVar2->_M_string_length = 0;
    *(psVar2->_M_dataplus)._M_p = '\0';
    uVar1 = (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0x3e) != 0) {
    this->channels_ = 0;
    this->height_ = 0;
    this->width_ = 0;
    this->label_ = 0;
    this->encoded_ = false;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void Datum::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.Datum)
  float_data_.Clear();
  if (has_data()) {
    GOOGLE_DCHECK(!data_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*data_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 62u) {
    ::memset(&channels_, 0, reinterpret_cast<char*>(&encoded_) -
      reinterpret_cast<char*>(&channels_) + sizeof(encoded_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}